

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_MRIStepInnerFullRhs
              (MRIStepInnerStepper stepper,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  int iVar1;
  N_Vector in_RDI;
  undefined8 in_XMM0_Qa;
  int mode_00;
  sunrealtype unaff_retaddr;
  ARKodeMem in_stack_00000008;
  int retval;
  void *arkode_mem;
  MRIStepInnerStepper in_stack_ffffffffffffffb8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  mode_00 = (int)((ulong)in_XMM0_Qa >> 0x20);
  iVar1 = MRIStepInnerStepper_GetContent(in_stack_ffffffffffffffb8,(void **)0x12574c);
  if (iVar1 == 0) {
    iVar1 = arkStep_FullRHS(in_stack_00000008,unaff_retaddr,
                            (N_Vector)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI,mode_00);
  }
  return iVar1;
}

Assistant:

int arkStep_MRIStepInnerFullRhs(MRIStepInnerStepper stepper, sunrealtype t,
                                N_Vector y, N_Vector f, int mode)
{
  void* arkode_mem;
  int retval;

  /* extract the ARKODE memory struct */
  retval = MRIStepInnerStepper_GetContent(stepper, &arkode_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  return (arkStep_FullRHS(arkode_mem, t, y, f, mode));
}